

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
__thiscall
wabt::
MakeUnique<wabt::LexerSourceLineFinder,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>>
          (wabt *this,unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args)

{
  LexerSourceLineFinder *this_00;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> local_20;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *local_18;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args_local;
  
  local_18 = args;
  args_local = (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)this;
  this_00 = (LexerSourceLineFinder *)operator_new(0x30);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::unique_ptr
            (&local_20,local_18);
  LexerSourceLineFinder::LexerSourceLineFinder(this_00,&local_20);
  std::unique_ptr<wabt::LexerSourceLineFinder,std::default_delete<wabt::LexerSourceLineFinder>>::
  unique_ptr<std::default_delete<wabt::LexerSourceLineFinder>,void>
            ((unique_ptr<wabt::LexerSourceLineFinder,std::default_delete<wabt::LexerSourceLineFinder>>
              *)this,this_00);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}